

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftlzw.c
# Opt level: O3

void ft_lzw_stream_close(FT_Stream stream)

{
  undefined8 *P;
  FT_Memory memory;
  
  P = (undefined8 *)(stream->descriptor).pointer;
  if (P != (undefined8 *)0x0) {
    memory = stream->memory;
    ft_lzwstate_done((FT_LzwState)(P + 3));
    P[2] = 0;
    *P = 0;
    P[1] = 0;
    ft_mem_free(memory,P);
    (stream->descriptor).value = 0;
  }
  return;
}

Assistant:

static void
  ft_lzw_stream_close( FT_Stream  stream )
  {
    FT_LZWFile  zip    = (FT_LZWFile)stream->descriptor.pointer;
    FT_Memory   memory = stream->memory;


    if ( zip )
    {
      /* finalize lzw file descriptor */
      ft_lzw_file_done( zip );

      FT_FREE( zip );

      stream->descriptor.pointer = NULL;
    }
  }